

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.c
# Opt level: O1

void PrintUsage(void)

{
  fwrite("usage: sq <options> <scriptpath [args]>.\nAvailable options are:\n   -c              compiles the file to bytecode(default output \'out.cnut\')\n   -o              specifies output file for the -c option\n   -c              compiles only\n   -d              generates debug infos\n   -v              displays version infos\n   -h              prints help\n"
         ,0x15a,1,_stderr);
  return;
}

Assistant:

void PrintUsage()
{
// One can't call an Ndless program with arguments IIRC
#ifndef _TINSPIRE
    scfprintf(stderr,_SC("usage: sq <options> <scriptpath [args]>.\n")
        _SC("Available options are:\n")
        _SC("   -c              compiles the file to bytecode(default output 'out.cnut')\n")
        _SC("   -o              specifies output file for the -c option\n")
        _SC("   -c              compiles only\n")
        _SC("   -d              generates debug infos\n")
        _SC("   -v              displays version infos\n")
        _SC("   -h              prints help\n"));
#endif
}